

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# body_centered_cubic.hpp
# Opt level: O2

char * __thiscall
sisl::body_centered_cubic<char>::operator()(body_centered_cubic<char> *this,int d0,...)

{
  char in_AL;
  bool bVar1;
  int iVar2;
  char *pcVar3;
  undefined8 *puVar4;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  int local_e4;
  int local_e0;
  int _x;
  va_list vl;
  undefined1 local_b8 [16];
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  undefined8 local_18;
  
  vl[0].reg_save_area = local_b8;
  if (in_AL != '\0') {
    local_88 = in_XMM0_Qa;
    local_78 = in_XMM1_Qa;
    local_68 = in_XMM2_Qa;
    local_58 = in_XMM3_Qa;
    local_48 = in_XMM4_Qa;
    local_38 = in_XMM5_Qa;
    local_28 = in_XMM6_Qa;
    local_18 = in_XMM7_Qa;
  }
  vl[0].overflow_arg_area = &stack0x00000008;
  local_a8._0_4_ = (int)in_RDX;
  vl[0].gp_offset = 0x20;
  vl[0].fp_offset = 0x30;
  local_e4 = (int)local_a8;
  local_e0 = (int)local_a0;
  this->__zero = '\0';
  _x = d0;
  local_a8 = in_RDX;
  local_a0 = in_RCX;
  local_98 = in_R8;
  local_90 = in_R9;
  iVar2 = (*(this->super_base_lattice<char>)._vptr_base_lattice[0xf])(this);
  if ((char)iVar2 == '\0') {
    puVar4 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar4 = "body_centered_cubic::operator() - given non lattice site!";
    __cxa_throw(puVar4,&char_const*::typeinfo,0);
  }
  bVar1 = in_bound(this,&_x,&local_e4,&local_e0);
  if (bVar1) {
    pcVar3 = array_n<char,_3,_std::allocator<char>_>::operator()
                       (&this->_array,(_x - local_e0 % 2) / 2,
                        (long)(local_e4 - local_e0 % 2) / 2 & 0xffffffff);
  }
  else {
    pcVar3 = &this->__zero;
  }
  return pcVar3;
}

Assistant:

virtual T& operator()(int d0, ...) {
            int _x = d0, _y = 0, _z = 0;
            int ax, ay, az;
            va_list vl;

            va_start(vl, d0);
            _y = va_arg(vl, int);
            _z = va_arg(vl, int);
            va_end(vl);
            __zero = 0;

            if(!is_lattice_site(_x, _y, _z)) throw "body_centered_cubic::operator() - given non lattice site!";
            if(!in_bound(_x, _y, _z))  return __zero;

            // Transform to 3d array index
            {
                int zmod = _z % 2;
                ax = (_x - zmod) / 2;
                ay = (_y - zmod) / 2;
                az = _z;
            }

            return _array(ax, ay, az);
        }